

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

hts_idx_t * hts_idx_init(int n,int fmt,uint64_t offset0,int min_shift,int n_lvls)

{
  hts_idx_t *__ptr;
  bidx_t **__ptr_00;
  lidx_t *plVar1;
  
  __ptr = (hts_idx_t *)calloc(1,0x88);
  if (__ptr != (hts_idx_t *)0x0) {
    __ptr->fmt = fmt;
    __ptr->min_shift = min_shift;
    __ptr->n_lvls = n_lvls;
    __ptr->n_bins = (uint)~(-1 << ((char)n_lvls * '\x03' + 3U & 0x1f)) / 7;
    (__ptr->z).save_tid = -1;
    (__ptr->z).off_end = offset0;
    (__ptr->z).off_beg = offset0;
    (__ptr->z).last_off = offset0;
    (__ptr->z).save_off = offset0;
    (__ptr->z).last_bin = 0xffffffff;
    (__ptr->z).save_bin = 0xffffffff;
    (__ptr->z).last_coor = -1;
    (__ptr->z).last_tid = -1;
    if (n == 0) {
      return __ptr;
    }
    __ptr->m = n;
    __ptr->n = n;
    __ptr_00 = (bidx_t **)calloc((long)n,8);
    __ptr->bidx = __ptr_00;
    if (__ptr_00 != (bidx_t **)0x0) {
      plVar1 = (lidx_t *)calloc((long)n,0x10);
      __ptr->lidx = plVar1;
      if (plVar1 != (lidx_t *)0x0) {
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (hts_idx_t *)0x0;
}

Assistant:

hts_idx_t *hts_idx_init(int n, int fmt, uint64_t offset0, int min_shift, int n_lvls)
{
    hts_idx_t *idx;
    idx = (hts_idx_t*)calloc(1, sizeof(hts_idx_t));
    if (idx == NULL) return NULL;
    idx->fmt = fmt;
    idx->min_shift = min_shift;
    idx->n_lvls = n_lvls;
    idx->n_bins = ((1<<(3 * n_lvls + 3)) - 1) / 7;
    idx->z.save_bin = idx->z.save_tid = idx->z.last_tid = idx->z.last_bin = 0xffffffffu;
    idx->z.save_off = idx->z.last_off = idx->z.off_beg = idx->z.off_end = offset0;
    idx->z.last_coor = 0xffffffffu;
    if (n) {
        idx->n = idx->m = n;
        idx->bidx = (bidx_t**)calloc(n, sizeof(bidx_t*));
        if (idx->bidx == NULL) { free(idx); return NULL; }
        idx->lidx = (lidx_t*) calloc(n, sizeof(lidx_t));
        if (idx->lidx == NULL) { free(idx->bidx); free(idx); return NULL; }
    }
    return idx;
}